

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_primitive_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::csharp::PrimitiveFieldGenerator::GenerateSerializedSizeCode
          (PrimitiveFieldGenerator *this,Printer *printer)

{
  Printer *this_00;
  Type type;
  mapped_type *args_3;
  AlphaNum *a;
  allocator local_91;
  key_type local_90;
  AlphaNum local_70;
  string local_40;
  int local_1c;
  Printer *pPStack_18;
  int fixedSize;
  Printer *printer_local;
  PrimitiveFieldGenerator *this_local;
  
  pPStack_18 = printer;
  printer_local = (Printer *)this;
  io::Printer::Print(printer,&(this->super_FieldGeneratorBase).variables_,
                     "if ($has_property_check$) {\n");
  io::Printer::Indent(pPStack_18);
  type = FieldDescriptor::type((this->super_FieldGeneratorBase).descriptor_);
  local_1c = GetFixedSize(type);
  this_00 = pPStack_18;
  if (local_1c == -1) {
    io::Printer::Print(pPStack_18,&(this->super_FieldGeneratorBase).variables_,
                       "size += $tag_size$ + pb::CodedOutputStream.Compute$capitalized_type_name$Size($property_name$);\n"
                      );
  }
  else {
    strings::AlphaNum::AlphaNum(&local_70,local_1c);
    StrCat_abi_cxx11_(&local_40,(protobuf *)&local_70,a);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_90,"tag_size",&local_91);
    args_3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&(this->super_FieldGeneratorBase).variables_,&local_90);
    io::Printer::Print<char[11],std::__cxx11::string,char[9],std::__cxx11::string>
              (this_00,"size += $tag_size$ + $fixed_size$;\n",(char (*) [11])"fixed_size",&local_40,
               (char (*) [9])"tag_size",args_3);
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
    std::__cxx11::string::~string((string *)&local_40);
  }
  io::Printer::Outdent(pPStack_18);
  io::Printer::Print<>(pPStack_18,"}\n");
  return;
}

Assistant:

void PrimitiveFieldGenerator::GenerateSerializedSizeCode(io::Printer* printer) {
  printer->Print(
    variables_,
    "if ($has_property_check$) {\n");
  printer->Indent();
  int fixedSize = GetFixedSize(descriptor_->type());
  if (fixedSize == -1) {
    printer->Print(
      variables_,
      "size += $tag_size$ + pb::CodedOutputStream.Compute$capitalized_type_name$Size($property_name$);\n");
  } else {
    printer->Print(
      "size += $tag_size$ + $fixed_size$;\n",
      "fixed_size", StrCat(fixedSize),
      "tag_size", variables_["tag_size"]);
  }
  printer->Outdent();
  printer->Print("}\n");
}